

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall fasttext::DenseMatrix::uniform(DenseMatrix *this,real a,uint thread,int32_t seed)

{
  ulong uVar1;
  uint uVar2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  thread local_60;
  long *local_58;
  real local_4c;
  undefined1 local_48 [16];
  pointer local_38;
  
  if (thread < 2) {
    uniformThread(this,a,0,seed);
    return;
  }
  local_48._0_12_ = ZEXT412(0);
  local_48._12_4_ = 0;
  uVar2 = 0;
  local_38 = (pointer)0x0;
  local_4c = a;
  while( true ) {
    local_60._M_id._M_thread = (id)0;
    local_58 = (long *)operator_new(0x20);
    *local_58 = (long)&PTR___State_00150578;
    local_58[1] = (long)this;
    *(real *)(local_58 + 2) = local_4c;
    *(uint *)((long)local_58 + 0x14) = uVar2;
    *(int32_t *)(local_58 + 3) = seed;
    std::thread::_M_start_thread(&local_60,&local_58,0);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_48,&local_60);
    if (local_60._M_id._M_thread != 0) break;
    uVar2 = uVar2 + 1;
    if (thread == uVar2) {
      if (local_48._8_8_ != local_48._0_8_) {
        uVar1 = 0;
        do {
          std::thread::join();
          uVar1 = uVar1 + 1;
        } while (uVar1 < (ulong)((long)(local_48._8_8_ - local_48._0_8_) >> 3));
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_48);
      return;
    }
  }
  std::terminate();
}

Assistant:

void DenseMatrix::uniform(real a, unsigned int thread, int32_t seed) {
  if (thread > 1) {
    std::vector<std::thread> threads;
    for (int i = 0; i < thread; i++) {
      threads.push_back(std::thread([=]() { uniformThread(a, i, seed); }));
    }
    for (int32_t i = 0; i < threads.size(); i++) {
      threads[i].join();
    }
  } else {
    // webassembly can't instantiate `std::thread`
    uniformThread(a, 0, seed);
  }
}